

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O3

bool google::protobuf::util::ParseDelimitedFromZeroCopyStream
               (MessageLite *message,ZeroCopyInputStream *input,bool *clean_eof)

{
  bool bVar1;
  undefined1 auStack_78 [8];
  CodedInputStream coded_input;
  
  auStack_78 = (undefined1  [8])0x0;
  coded_input.buffer_ = (uint8 *)0x0;
  coded_input.input_._0_6_ = 0;
  coded_input.input_._6_2_ = 0;
  coded_input._24_6_ = 0;
  coded_input.last_tag_ = 0x7fffffff;
  coded_input.legitimate_message_end_ = false;
  coded_input.aliasing_enabled_ = false;
  coded_input._38_2_ = 0;
  coded_input.current_limit_ = 0x7fffffff;
  coded_input.buffer_size_after_limit_ = io::CodedInputStream::default_recursion_limit_;
  coded_input.total_bytes_limit_ = io::CodedInputStream::default_recursion_limit_;
  coded_input.recursion_limit_ = 0;
  coded_input._60_4_ = 0;
  coded_input.extension_pool_ = (DescriptorPool *)0x0;
  coded_input.buffer_end_ = (uint8 *)input;
  io::CodedInputStream::Refresh((CodedInputStream *)auStack_78);
  bVar1 = ParseDelimitedFromCodedStream(message,(CodedInputStream *)auStack_78,clean_eof);
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)auStack_78);
  return bVar1;
}

Assistant:

bool ParseDelimitedFromZeroCopyStream(MessageLite* message,
                                      io::ZeroCopyInputStream* input,
                                      bool* clean_eof) {
  io::CodedInputStream coded_input(input);
  return ParseDelimitedFromCodedStream(message, &coded_input, clean_eof);
}